

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

char * Qiniu_String_Concat(char *s1,...)

{
  char *__s;
  char in_AL;
  size_t __n;
  ulong uVar1;
  size_t sVar2;
  char *__dest;
  void **ppvVar3;
  void **ppvVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint uVar5;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t sVar6;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  uint local_108;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_e8[1] = (void *)in_RSI;
  local_e8[2] = (void *)in_RDX;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  __n = strlen(s1);
  ppvVar3 = &ap[0].overflow_arg_area;
  uVar5 = 8;
  sVar6 = __n;
  while( true ) {
    if (uVar5 < 0x29) {
      uVar1 = (ulong)uVar5;
      uVar5 = uVar5 + 8;
      ppvVar4 = (void **)((long)local_e8 + uVar1);
    }
    else {
      ppvVar4 = ppvVar3;
      ppvVar3 = ppvVar3 + 1;
    }
    if ((char *)*ppvVar4 == (char *)0x0) break;
    sVar2 = strlen((char *)*ppvVar4);
    sVar6 = sVar6 + sVar2;
  }
  __dest = (char *)malloc(sVar6 + 1);
  ppvVar3 = &ap[0].overflow_arg_area;
  memcpy(__dest,s1,__n);
  local_108 = 8;
  while( true ) {
    if (local_108 < 0x29) {
      uVar1 = (ulong)local_108;
      local_108 = local_108 + 8;
      ppvVar4 = (void **)((long)local_e8 + uVar1);
    }
    else {
      ppvVar4 = ppvVar3;
      ppvVar3 = ppvVar3 + 1;
    }
    __s = (char *)*ppvVar4;
    if (__s == (char *)0x0) break;
    sVar6 = strlen(__s);
    memcpy(__dest + __n,__s,sVar6);
    __n = __n + sVar6;
  }
  __dest[__n] = '\0';
  return __dest;
}

Assistant:

char *Qiniu_String_Concat(const char *s1, ...)
{
	va_list ap;
	char *p;
	const char *s;
	size_t len, slen, len1 = strlen(s1);

	va_start(ap, s1);
	len = len1;
	for (;;)
	{
		s = va_arg(ap, const char *);
		if (s == NULL)
		{
			break;
		}
		len += strlen(s);
	}

	p = (char *)malloc(len + 1);

	va_start(ap, s1);
	memcpy(p, s1, len1);
	len = len1;
	for (;;)
	{
		s = va_arg(ap, const char *);
		if (s == NULL)
		{
			break;
		}
		slen = strlen(s);
		memcpy(p + len, s, slen);
		len += slen;
	}
	p[len] = '\0';
	return p;
}